

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

FunctionDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::FunctionDeclarationSyntax,slang::syntax::SyntaxKind&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::syntax::FunctionPrototypeSyntax&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::SyntaxNode>const&,slang::parsing::Token&,slang::syntax::NamedBlockClauseSyntax*&>
          (BumpAllocator *this,SyntaxKind *args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,FunctionPrototypeSyntax *args_2
          ,Token *args_3,SyntaxList<slang::syntax::SyntaxNode> *args_4,Token *args_5,
          NamedBlockClauseSyntax **args_6)

{
  Token semi;
  Token end;
  FunctionDeclarationSyntax *pFVar1;
  Info *in_RCX;
  SyntaxList<slang::syntax::SyntaxNode> *in_RSI;
  undefined8 in_RDI;
  undefined8 *in_R8;
  FunctionDeclarationSyntax *in_R9;
  Info *unaff_retaddr;
  NamedBlockClauseSyntax *in_stack_00000008;
  size_t in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  BumpAllocator *in_stack_ffffffffffffffa8;
  
  pFVar1 = (FunctionDeclarationSyntax *)
           allocate(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  semi.info = in_RCX;
  semi._0_8_ = in_R8;
  end.info = unaff_retaddr;
  end.kind = (short)in_RDI;
  end._2_1_ = (char)((ulong)in_RDI >> 0x10);
  end.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
  end.rawLen = (int)((ulong)in_RDI >> 0x20);
  slang::syntax::FunctionDeclarationSyntax::FunctionDeclarationSyntax
            (in_R9,(SyntaxKind)((ulong)in_R8[1] >> 0x20),
             (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)*in_R8,
             (FunctionPrototypeSyntax *)(in_stack_00000008->super_SyntaxNode).parent,semi,in_RSI,end
             ,in_stack_00000008);
  return pFVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }